

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic10::Run(UnitTest_semantic10 *this)

{
  bool bVar1;
  byte bVar2;
  SemanticException *anon_var_0_1;
  SemanticException *anon_var_0;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffdc0;
  allocator *this_00;
  allocator *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [55];
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [47];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [47];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [47];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"a = 1 > 2",&local_31);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffde8);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a7dad);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"\'Semantic(\"a = 1 > 2\")\'",&local_69);
    UnitTestBase::Error((UnitTestBase *)
                        CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                        (string *)in_stack_fffffffffffffde8);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"a = \'str\' >= \'str\'",&local_99);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffde8);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a7f2e);
  bVar2 = bVar1 ^ 0xff;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if ((bVar2 & 1) != 0) {
    in_stack_fffffffffffffde8 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,"\'Semantic(\"a = \'str\' >= \'str\'\")\'",in_stack_fffffffffffffde8);
    UnitTestBase::Error((UnitTestBase *)CONCAT17(bVar2,in_stack_fffffffffffffdf0),
                        (string *)in_stack_fffffffffffffde8);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"a = 1 > b",&local_f1);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffde8);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a80af);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"\'Semantic(\"a = 1 > b\")\'",&local_119);
    UnitTestBase::Error((UnitTestBase *)CONCAT17(bVar2,in_stack_fffffffffffffdf0),
                        (string *)in_stack_fffffffffffffde8);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"a = 1 < \'str\'",&local_149);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffde8);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  this_00 = &local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_170,"\'{ Semantic(\"a = 1 < \'str\'\"); }\' has no luna::SemanticException",
             this_00);
  UnitTestBase::Error((UnitTestBase *)CONCAT17(bVar2,in_stack_fffffffffffffdf0),
                      (string *)in_stack_fffffffffffffde8);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"a = true <= false",&local_1a9);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffde8);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)this_00);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d0,"\'{ Semantic(\"a = true <= false\"); }\' has no luna::SemanticException",
             &local_1d1);
  UnitTestBase::Error((UnitTestBase *)CONCAT17(bVar2,in_stack_fffffffffffffdf0),
                      (string *)in_stack_fffffffffffffde8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  return;
}

Assistant:

TEST_CASE(semantic10)
{
    EXPECT_TRUE(Semantic("a = 1 > 2"));
    EXPECT_TRUE(Semantic("a = 'str' >= 'str'"));
    EXPECT_TRUE(Semantic("a = 1 > b"));
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = 1 < 'str'");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = true <= false");
    });
}